

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testtool.c
# Opt level: O0

int print_opcode(int pc,DLbyte *addr,fnhead *fnobj)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  LispPTR index;
  int local_28;
  int len;
  int i;
  int op;
  fnhead *fnobj_local;
  DLbyte *addr_local;
  int pc_local;
  
  bVar1 = *(byte *)((ulong)addr ^ 3);
  uVar3 = (uint)bVar1;
  uVar2 = oplength[(int)uVar3];
  printf(" 0%04o (0x%04x)    ",(ulong)(uint)pc,(ulong)(uint)pc);
  for (local_28 = 0; local_28 < (int)(uVar2 + 1); local_28 = local_28 + 1) {
    printf("%4o",(ulong)*(byte *)((ulong)(addr + local_28) ^ 3));
  }
  for (; local_28 < 9; local_28 = local_28 + 1) {
    printf("    ");
  }
  printf("%s",opcode_table[(int)uVar3]);
  fnobj_local = (fnhead *)addr;
  switch(uVar3) {
  case 0:
    putchar(10);
    return -1;
  default:
    putchar(10);
    break;
  case 0xd:
    printf("(%d)",(ulong)*(byte *)((ulong)(addr + 1) ^ 3));
    fnobj_local = (fnhead *)(addr + 1);
  case 6:
  case 8:
  case 9:
  case 10:
  case 0xb:
  case 0xc:
  case 0x17:
  case 0x2e:
  case 0x60:
  case 0x67:
  case 0xc3:
    putchar(0x20);
    print_atomname((uint)*(byte *)((ulong)((long)&fnobj_local->na + 1U) ^ 3) * 0x1000000 +
                   (uint)*(byte *)((ulong)&fnobj_local->stkmin ^ 3) * 0x10000 +
                   (uint)*(byte *)((ulong)((long)&fnobj_local->stkmin + 1U) ^ 3) * 0x100 +
                   (uint)*(byte *)((ulong)&fnobj_local->startpc ^ 3));
    putchar(10);
    break;
  case 0x50:
  case 0x51:
  case 0x52:
  case 0x53:
  case 0x54:
  case 0x55:
  case 0x56:
    putchar(0x20);
    index = get_fn_fvar_name(fnobj,bVar1 - 0x50);
    print_atomname(index);
    putchar(10);
    break;
  case 0x80:
  case 0x81:
  case 0x82:
  case 0x83:
  case 0x84:
  case 0x85:
  case 0x86:
  case 0x87:
  case 0x88:
  case 0x89:
  case 0x8a:
  case 0x8b:
  case 0x8c:
  case 0x8d:
  case 0x8e:
  case 0x8f:
    printf(" 0%o (0x%x)\n",(ulong)((pc + uVar3) - 0x7e),(ulong)((pc + uVar3) - 0x7e));
    break;
  case 0x90:
  case 0x91:
  case 0x92:
  case 0x93:
  case 0x94:
  case 0x95:
  case 0x96:
  case 0x97:
  case 0x98:
  case 0x99:
  case 0x9a:
  case 0x9b:
  case 0x9c:
  case 0x9d:
  case 0x9e:
  case 0x9f:
    printf(" 0%o (0x%x)\n",(ulong)((pc + uVar3) - 0x8e),(ulong)((pc + uVar3) - 0x8e));
    break;
  case 0xa0:
  case 0xa1:
  case 0xa2:
  case 0xa3:
  case 0xa4:
  case 0xa5:
  case 0xa6:
  case 0xa7:
  case 0xa8:
  case 0xa9:
  case 0xaa:
  case 0xab:
  case 0xac:
  case 0xad:
  case 0xae:
  case 0xaf:
    printf(" 0%o (0x%x)\n",(ulong)((pc + uVar3) - 0x9e),(ulong)((pc + uVar3) - 0x9e));
    break;
  case 0xb0:
  case 0xb2:
  case 0xb3:
  case 0xb4:
  case 0xb5:
    printf(" 0%o (0x%x)\n",(ulong)(uint)(pc + *(char *)((ulong)(addr + 1) ^ 3)),
           (ulong)(uint)(pc + *(char *)((ulong)(addr + 1) ^ 3)));
    break;
  case 0xb1:
    printf(" 0%o (0x%x)\n",
           (ulong)(pc + *(char *)((ulong)(addr + 1) ^ 3) * 0x100 +
                  (uint)*(byte *)((ulong)(addr + 2) ^ 3)),
           (ulong)(pc + *(char *)((ulong)(addr + 1) ^ 3) * 0x100 +
                  (uint)*(byte *)((ulong)(addr + 2) ^ 3)));
  }
  fflush(_stdout);
  return uVar2 + 1;
}

Assistant:

int print_opcode(int pc, DLbyte *addr, struct fnhead *fnobj) {
  /* Print the opcode at addr, including args, and return length */
  /* if this opcode is the last, return -1			   */
  int op = (int)(0xFF & GETBYTE(addr));
  int i;
  extern unsigned int oplength[256];
  int len = oplength[op] + 1;

  printf(" 0%04o (0x%04x)    ", pc, pc);
  for (i = 0; i < len; i++) printf("%4o", 0xFF & GETBYTE(addr + i));
  for (; i < 9; i++) printf("    ");
  printf("%s", opcode_table[op]);

  switch (op) {
    case 0:
      putchar('\n'); /* End of function */
      return (-1);
    case 015:
      printf("(%d)", (unsigned char)GETBYTE(addr + 1));
      addr += 1; /* FNX uses an extra byte */
                 /* Fall thru to the name print */
    case 006:    /* DTEST */
    case 010:    /* FN0-4 */
    case 011:
    case 012:
    case 013:
    case 014:
    case 027:  /* GVAR_ */
    case 0140: /* GVAR */
    case 0303: /* INSTANCEP */
    case 056:  /* TYPENAMEP */
    case 0147: putchar(' ');
#ifdef BIGVM
      print_atomname(((unsigned char)GETBYTE(addr + 1) << 24) +
                     ((unsigned char)GETBYTE(addr + 2) << 16) +
                     ((unsigned char)GETBYTE(addr + 3) << 8) + (unsigned char)GETBYTE(addr + 4));
#elif defined(BIGATOMS)
      print_atomname(((unsigned char)GETBYTE(addr + 1) << 16) +
                     ((unsigned char)GETBYTE(addr + 2) << 8) + (unsigned char)GETBYTE(addr + 3));
#else
      print_atomname(((unsigned char)GETBYTE(addr + 1) << 8) + (unsigned char)GETBYTE(addr + 2));
#endif /* BIGATOMS */

      putchar('\n');
      break;
    case 0200: /* Jump opcodes */
    case 0201:
    case 0202:
    case 0203:
    case 0204:
    case 0205:
    case 0206:
    case 0207:
    case 0210:
    case 0211:
    case 0212:
    case 0213:
    case 0214:
    case 0215:
    case 0216:
    case 0217: printf(" 0%o (0x%x)\n", pc + 2 + op - 0200, pc + 2 + op - 0200); break;
    case 0220: /* FJUMP opcodes */
    case 0221:
    case 0222:
    case 0223:
    case 0224:
    case 0225:
    case 0226:
    case 0227:
    case 0230:
    case 0231:
    case 0232:
    case 0233:
    case 0234:
    case 0235:
    case 0236:
    case 0237: printf(" 0%o (0x%x)\n", pc + 2 + op - 0220, pc + 2 + op - 0220); break;
    case 0240: /* TJUMP opcodes */
    case 0241:
    case 0242:
    case 0243:
    case 0244:
    case 0245:
    case 0246:
    case 0247:
    case 0250:
    case 0251:
    case 0252:
    case 0253:
    case 0254:
    case 0255:
    case 0256:
    case 0257: printf(" 0%o (0x%x)\n", pc + 2 + op - 0240, pc + 2 + op - 0240); break;
    case 0260: /* JUMPX */
    case 0262: /* FJUMPX */
    case 0263: /* TJUMPX */
    case 0264: /* NFJUMPX */
    case 0265: /* NTJUMPX */
      printf(" 0%o (0x%x)\n", pc + (int8_t)GETBYTE(addr + 1), pc + (int8_t)GETBYTE(addr + 1));
      break;
    case 0261: /* JUMPXX */
      printf(" 0%o (0x%x)\n",
             pc + ((int8_t)GETBYTE(addr + 1) << 8) + (uint8_t)GETBYTE(addr + 2),
             pc + ((int8_t)GETBYTE(addr + 1) << 8) + (uint8_t)GETBYTE(addr + 2));
      break;
    case 0120: /* FVAR opcodes */
    case 0121:
    case 0122:
    case 0123:
    case 0124:
    case 0125:
    case 0126:
      putchar(' ');
      print_atomname(get_fn_fvar_name(fnobj, op - 0120));
      putchar('\n');
      break;
    default: putchar('\n');
  }
  fflush(stdout); /* Make sure each line is really printed as we go. */
  return (len);
}